

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
* __thiscall
GraphBuilder::getCorrespondingForks
          (set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
           *__return_storage_ptr__,GraphBuilder *this,CallInst *callInst)

{
  _Rb_tree_header *p_Var1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_> forks;
  CallInst *local_60;
  CallInst *local_58;
  _Rb_tree<ForkNode_*,_ForkNode_*,_std::_Identity<ForkNode_*>,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_>
  local_50;
  
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58 = callInst;
  cVar2 = std::
          _Hashtable<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->llvmToJoins_)._M_h,&local_58);
  if (cVar2.super__Node_iterator_base<std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_false>.
      _M_cur != (__node_type *)0x0) {
    JoinNode::correspondingForks
              ((set<ForkNode_*,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_> *)&local_50,
               *(JoinNode **)
                ((long)cVar2.
                       super__Node_iterator_base<std::pair<const_llvm::CallInst_*const,_JoinNode_*>,_false>
                       ._M_cur + 0x10));
    for (p_Var3 = local_50._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &local_50._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      local_60 = Node::callInstruction(*(Node **)(p_Var3 + 1));
      std::
      _Rb_tree<llvm::CallInst_const*,llvm::CallInst_const*,std::_Identity<llvm::CallInst_const*>,std::less<llvm::CallInst_const*>,std::allocator<llvm::CallInst_const*>>
      ::_M_insert_unique<llvm::CallInst_const*>
                ((_Rb_tree<llvm::CallInst_const*,llvm::CallInst_const*,std::_Identity<llvm::CallInst_const*>,std::less<llvm::CallInst_const*>,std::allocator<llvm::CallInst_const*>>
                  *)__return_storage_ptr__,&local_60);
    }
    std::
    _Rb_tree<ForkNode_*,_ForkNode_*,_std::_Identity<ForkNode_*>,_std::less<ForkNode_*>,_std::allocator<ForkNode_*>_>
    ::~_Rb_tree(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<const CallInst *>
GraphBuilder::getCorrespondingForks(const CallInst *callInst) const {
    std::set<const CallInst *> llvmForks;
    auto iterator = llvmToJoins_.find(callInst);
    if (iterator != llvmToJoins_.end()) {
        auto forks = iterator->second->correspondingForks();
        for (auto *fork : forks) {
            llvmForks.insert(fork->callInstruction());
        }
    }
    return llvmForks;
}